

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkClass.hpp
# Opt level: O2

void __thiscall
benchmarks::BenchmarksClass::AddBenchmark<long,void(*)(benchmarks::BenchmarkContext&,long)>
          (BenchmarksClass *this,string *name,_func_void_BenchmarkContext_ptr_long *benchmarkFunc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *orderedParamNames)

{
  undefined1 local_48 [40];
  pointer local_20;
  
  local_20 = (pointer)benchmarkFunc;
  std::
  make_shared<benchmarks::Benchmark<long>,std::__cxx11::string,void(*)(benchmarks::BenchmarkContext&,long),std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (_func_void_BenchmarkContext_ptr_long **)name,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_20);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,std::allocator<std::shared_ptr<benchmarks::IBenchmark>>>
  ::emplace_back<std::shared_ptr<benchmarks::IBenchmark>>
            ((vector<std::shared_ptr<benchmarks::IBenchmark>,std::allocator<std::shared_ptr<benchmarks::IBenchmark>>>
              *)&this->_benchmarks,(shared_ptr<benchmarks::IBenchmark> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

void AddBenchmark(std::string name, Functor_ benchmarkFunc, std::vector<std::string> orderedParamNames = {})
		{ _benchmarks.push_back(std::make_shared<Benchmark<BenchmarkParams_...>>(std::move(name), std::move(benchmarkFunc), std::move(orderedParamNames))); }